

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Object::Destroy(Am_Object *this)

{
  bool bVar1;
  Am_Object local_28;
  Am_Object_Data *local_20;
  Am_Object_Data *next;
  Am_Object_Data *current;
  Am_Object *this_local;
  
  if (this->data != (Am_Object_Data *)0x0) {
    current = (Am_Object_Data *)this;
    if ((this->data->owner_slot).super_Am_Value.value.wrapper_value != (Am_Wrapper *)0x0) {
      Remove_From_Owner(this);
    }
    bVar1 = Am_Wrapper::Is_Unique(&this->data->super_Am_Wrapper);
    if (!bVar1) {
      for (next = this->data->first_instance; next != (Am_Object_Data *)0x0;
          next = next->next_instance) {
        Am_Wrapper::Note_Reference(&next->super_Am_Wrapper);
      }
      next = this->data->first_instance;
      this->data->first_instance = (Am_Object_Data *)0x0;
      while (next != (Am_Object_Data *)0x0) {
        local_20 = next->next_instance;
        Am_Wrapper::Note_Reference(&next->super_Am_Wrapper);
        Am_Object(&local_28,next);
        Destroy(&local_28);
        ~Am_Object(&local_28);
        Am_Wrapper::Release(&next->super_Am_Wrapper);
        next = local_20;
      }
      if ((this->data->data).data != (char *)0x0) {
        Am_Object_Data::destroy_object(this->data);
      }
    }
    Am_Wrapper::Release(&this->data->super_Am_Wrapper);
    this->data = (Am_Object_Data *)0x0;
  }
  return;
}

Assistant:

void
Am_Object::Destroy()
{
#ifdef DEBUG
  Global_Call_Object_Trace(*this, Am_No_Object, Am_TRACE_OBJECT_DESTROYED);
#endif

  if (!data)
    return;

  if (data->owner_slot.value.wrapper_value)
    Remove_From_Owner();

  if (!data->Is_Unique()) {
    Am_Object_Data *current;
    Am_Object_Data *next;

    for (current = data->first_instance; current != nullptr;
         current = current->next_instance)
      current->Note_Reference(); // 1

    current = data->first_instance;
    data->first_instance = nullptr;
    for (; current != nullptr; current = next) {
      next = current->next_instance;
      current->Note_Reference();    // 2
      Am_Object(current).Destroy(); // 2
      current->Release();           // 1
    }

    if (data->data.data)
      data->destroy_object();
  }

  data->Release();
  data = nullptr;
}